

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseCompiler::_newFuncNode(BaseCompiler *this,FuncNode **out,FuncSignature *signature)

{
  Error EVar1;
  uint32_t uVar2;
  ArgPack *__s;
  FuncNode *funcNode;
  SentinelType local_24;
  
  *out = (FuncNode *)0x0;
  EVar1 = BaseBuilder::_newNodeT<asmjit::FuncNode>(&this->super_BaseBuilder,&funcNode);
  if (EVar1 != 0) {
    return EVar1;
  }
  EVar1 = BaseBuilder::_newLabelNode(&this->super_BaseBuilder,&funcNode->_exitNode);
  if (EVar1 != 0) {
    return EVar1;
  }
  local_24 = kSentinelFuncEnd;
  EVar1 = BaseBuilder::_newNodeT<asmjit::SentinelNode,asmjit::SentinelNode::SentinelType>
                    (&this->super_BaseBuilder,&funcNode->_end,&local_24);
  if (EVar1 != 0) {
    return EVar1;
  }
  EVar1 = FuncDetail::init((FuncDetail *)&(funcNode->super_LabelNode).field_0x34,
                           (EVP_PKEY_CTX *)signature);
  if (EVar1 == 0) {
    uVar2 = Environment::stackAlignment(&(this->super_BaseBuilder).super_BaseEmitter._environment);
    if ((byte)funcNode->field_0x39 < uVar2) {
      funcNode->field_0x39 = (char)uVar2;
    }
    EVar1 = FuncFrame::init(&funcNode->_frame,
                            (EVP_PKEY_CTX *)&(funcNode->super_LabelNode).field_0x34);
    if (EVar1 == 0) {
      funcNode->_args = (ArgPack *)0x0;
      if (funcNode->field_0xa4 != 0) {
        __s = (ArgPack *)
              ZoneAllocator::alloc
                        (&(this->super_BaseBuilder)._allocator,
                         (ulong)(byte)funcNode->field_0xa4 << 5);
        funcNode->_args = __s;
        if (__s == (ArgPack *)0x0) {
          EVar1 = 1;
          goto LAB_00110c8f;
        }
        memset(__s,0,(ulong)(byte)funcNode->field_0xa4 << 5);
      }
      EVar1 = BaseBuilder::registerLabelNode(&this->super_BaseBuilder,&funcNode->super_LabelNode);
      if (EVar1 != 0) {
        return EVar1;
      }
      *out = funcNode;
      return 0;
    }
  }
LAB_00110c8f:
  EVar1 = BaseEmitter::reportError((BaseEmitter *)this,EVar1,(char *)0x0);
  return EVar1;
}

Assistant:

Error BaseCompiler::_newFuncNode(FuncNode** out, const FuncSignature& signature) {
  *out = nullptr;

  // Create FuncNode together with all the required surrounding nodes.
  FuncNode* funcNode;
  ASMJIT_PROPAGATE(_newNodeT<FuncNode>(&funcNode));
  ASMJIT_PROPAGATE(_newLabelNode(&funcNode->_exitNode));
  ASMJIT_PROPAGATE(_newNodeT<SentinelNode>(&funcNode->_end, SentinelNode::kSentinelFuncEnd));

  // Initialize the function's detail info.
  Error err = funcNode->detail().init(signature, environment());
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  // If the Target guarantees greater stack alignment than required by the
  // calling convention then override it as we can prevent having to perform
  // dynamic stack alignment
  uint32_t environmentStackAlignment = _environment.stackAlignment();

  if (funcNode->_funcDetail._callConv.naturalStackAlignment() < environmentStackAlignment)
    funcNode->_funcDetail._callConv.setNaturalStackAlignment(environmentStackAlignment);

  // Initialize the function frame.
  err = funcNode->_frame.init(funcNode->_funcDetail);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  // Allocate space for function arguments.
  funcNode->_args = nullptr;
  if (funcNode->argCount() != 0) {
    funcNode->_args = _allocator.allocT<FuncNode::ArgPack>(funcNode->argCount() * sizeof(FuncNode::ArgPack));
    if (ASMJIT_UNLIKELY(!funcNode->_args))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    memset(funcNode->_args, 0, funcNode->argCount() * sizeof(FuncNode::ArgPack));
  }

  ASMJIT_PROPAGATE(registerLabelNode(funcNode));

  *out = funcNode;
  return kErrorOk;
}